

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h265d_parser.c
# Opt level: O2

MPP_RET h265d_callback(void *ctx,void *err_info)

{
  int iVar1;
  long lVar2;
  long lVar3;
  MppFrame frame;
  
  lVar2 = *ctx;
  if (*(int *)(*(long *)((long)ctx + 0x50) + 0x30) == 0) {
    frame = (MppFrame)0x0;
    if ((*(uint *)(lVar2 + 0x1158) & 0xfffffff8) == 0x10) {
      _mpp_log_l(4,"H265D_PARSER","IS_IRAP frame found error",(char *)0x0);
      *(undefined4 *)(lVar2 + 0x1120) = 0x7fffffff;
    }
    mpp_buf_slot_get_prop
              (*(MppBufSlots *)(lVar2 + 0x25710),*(RK_S32 *)((long)err_info + 0x34),SLOT_FRAME_PTR,
               &frame);
    mpp_frame_set_errinfo(frame,1);
    iVar1 = *(int *)((long)err_info + 0x34);
    for (lVar3 = 0; lVar3 != 0x440; lVar3 = lVar3 + 0x40) {
      if (*(int *)(lVar2 + 0xd04 + lVar3) == iVar1) {
        *(undefined1 *)(lVar2 + 0xd08 + lVar3) = 1;
      }
    }
  }
  if ((*(byte *)((long)err_info + 8) & 4) == 0) {
    *(undefined1 *)(lVar2 + 0x25743) = 0;
  }
  return MPP_OK;
}

Assistant:

MPP_RET h265d_callback(void *ctx, void *err_info)
{
    H265dContext_t *h265dctx = (H265dContext_t *)ctx;
    HalDecTask *task_dec = (HalDecTask *)err_info;
    HEVCContext *s = (HEVCContext *)h265dctx->priv_data;

    if (!h265dctx->cfg->base.disable_error) {
        MppFrame frame = NULL;
        RK_U32 i = 0;

        if (s->first_nal_type >= 16 && s->first_nal_type <= 23) {
            mpp_log("IS_IRAP frame found error");
            s->max_ra = INT_MAX;
        }
        // s->miss_ref_flag = 1;
        mpp_buf_slot_get_prop(s->slots, task_dec->output, SLOT_FRAME_PTR, &frame);
        mpp_frame_set_errinfo(frame, MPP_FRAME_ERR_UNKNOW);
        for (i = 0; i < MPP_ARRAY_ELEMS(s->DPB); i++) {
            if (s->DPB[i].slot_index == task_dec->output) {
                s->DPB[i].error_flag = 1;
            }
        }
    }

    if (!task_dec->flags.parse_err)
        s->ps_need_upate = 0;

    (void) err_info;

    return MPP_OK;
}